

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

int llvm::totalExponent(iterator p,iterator end,int exponentAdjustment)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int local_28;
  uint value;
  int exponent;
  bool overflow;
  bool negative;
  int unsignedExponent;
  int exponentAdjustment_local;
  iterator end_local;
  iterator p_local;
  
  local_28 = 0;
  if (p == end) {
    __assert_fail("p != end && \"Exponent has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xf6,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
  }
  cVar1 = *p;
  if (((*p == '-') || (end_local = p, *p == '+')) && (end_local = p + 1, end_local == end)) {
    __assert_fail("p != end && \"Exponent has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xfb,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
  }
  exponent = 0;
  bVar2 = false;
  do {
    if (end_local == end) {
LAB_002090bb:
      if ((0x7fff < exponentAdjustment) || (exponentAdjustment < -0x8000)) {
        bVar2 = true;
      }
      if (!bVar2) {
        local_28 = exponent;
        if (cVar1 == '-') {
          local_28 = -exponent;
        }
        local_28 = exponentAdjustment + local_28;
        if ((0x7fff < local_28) || (local_28 < -0x8000)) {
          bVar2 = true;
        }
      }
      if ((bVar2) && (local_28 = 0x7fff, cVar1 == '-')) {
        local_28 = -0x8000;
      }
      return local_28;
    }
    uVar3 = decDigitValue((int)*end_local);
    if (9 < uVar3) {
      __assert_fail("value < 10U && \"Invalid character in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x104,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)")
      ;
    }
    exponent = exponent * 10 + uVar3;
    if (0x7fff < exponent) {
      bVar2 = true;
      goto LAB_002090bb;
    }
    end_local = end_local + 1;
  } while( true );
}

Assistant:

static int
totalExponent(StringRef::iterator p, StringRef::iterator end,
              int exponentAdjustment)
{
  int unsignedExponent;
  bool negative, overflow;
  int exponent = 0;

  assert(p != end && "Exponent has no digits");

  negative = *p == '-';
  if (*p == '-' || *p == '+') {
    p++;
    assert(p != end && "Exponent has no digits");
  }

  unsignedExponent = 0;
  overflow = false;
  for (; p != end; ++p) {
    unsigned int value;

    value = decDigitValue(*p);
    assert(value < 10U && "Invalid character in exponent");

    unsignedExponent = unsignedExponent * 10 + value;
    if (unsignedExponent > 32767) {
      overflow = true;
      break;
    }
  }

  if (exponentAdjustment > 32767 || exponentAdjustment < -32768)
    overflow = true;

  if (!overflow) {
    exponent = unsignedExponent;
    if (negative)
      exponent = -exponent;
    exponent += exponentAdjustment;
    if (exponent > 32767 || exponent < -32768)
      overflow = true;
  }

  if (overflow)
    exponent = negative ? -32768: 32767;

  return exponent;
}